

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  time_t tVar1;
  CircBufTest *this;
  long lVar2;
  TestRunner runner;
  TestCase *test_set [9];
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  TestRunner::TestRunner(&runner,*argv);
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    this = (CircBufTest *)
           operator_new(0x288,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                        ,0x420);
    CircBufTest::CircBufTest(this,(int)lVar2);
    test_set[lVar2] = (TestCase *)this;
  }
  TestRunner::RunAll(&runner,test_set,9);
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
	srand(time(NULL));

	TestRunner runner( argv[ 0 ] );

	TestCase *test_set[ gNumberTests ];

	for ( int i = 0; i < gNumberTests; i++ )
		test_set[ i ] = jh_new CircBufTest( i );

	runner.RunAll( test_set, gNumberTests );

	return 0;


}